

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Status coda_XML_StopParser(XML_Parser parser,XML_Bool resumable)

{
  XML_Status XVar1;
  
  XVar1 = XML_STATUS_ERROR;
  if (parser == (XML_Parser)0x0) {
    return XVar1;
  }
  switch((parser->m_parsingStatus).parsing) {
  case XML_INITIALIZED:
    parser->m_errorCode = XML_ERROR_NOT_STARTED;
    return XVar1;
  case XML_PARSING:
    if (resumable != '\0') {
      if (parser->m_isParamEntity == '\0') {
        (parser->m_parsingStatus).parsing = XML_SUSPENDED;
        return XML_STATUS_OK;
      }
      parser->m_errorCode = XML_ERROR_SUSPEND_PE;
      return XVar1;
    }
    break;
  case XML_FINISHED:
    parser->m_errorCode = XML_ERROR_FINISHED;
    return XVar1;
  case XML_SUSPENDED:
    if (resumable != '\0') {
      parser->m_errorCode = XML_ERROR_SUSPENDED;
      return XVar1;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                  ,0x8d6,"enum XML_Status coda_XML_StopParser(XML_Parser, XML_Bool)");
  }
  (parser->m_parsingStatus).parsing = XML_FINISHED;
  return XML_STATUS_OK;
}

Assistant:

enum XML_Status XMLCALL
XML_StopParser(XML_Parser parser, XML_Bool resumable) {
  if (parser == NULL)
    return XML_STATUS_ERROR;
  switch (parser->m_parsingStatus.parsing) {
  case XML_INITIALIZED:
    parser->m_errorCode = XML_ERROR_NOT_STARTED;
    return XML_STATUS_ERROR;
  case XML_SUSPENDED:
    if (resumable) {
      parser->m_errorCode = XML_ERROR_SUSPENDED;
      return XML_STATUS_ERROR;
    }
    parser->m_parsingStatus.parsing = XML_FINISHED;
    break;
  case XML_FINISHED:
    parser->m_errorCode = XML_ERROR_FINISHED;
    return XML_STATUS_ERROR;
  case XML_PARSING:
    if (resumable) {
#ifdef XML_DTD
      if (parser->m_isParamEntity) {
        parser->m_errorCode = XML_ERROR_SUSPEND_PE;
        return XML_STATUS_ERROR;
      }
#endif
      parser->m_parsingStatus.parsing = XML_SUSPENDED;
    } else
      parser->m_parsingStatus.parsing = XML_FINISHED;
    break;
  default:
    assert(0);
  }
  return XML_STATUS_OK;
}